

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O3

void R_BuildPlayerTranslation(int player)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 *puVar3;
  float v;
  float s;
  float h;
  FPlayerColorSet *colorset;
  float local_3c;
  float local_38;
  float local_34;
  FPlayerColorSet *local_30;
  
  D_GetPlayerColor(player,&local_34,&local_38,&local_3c,&local_30);
  lVar2 = (long)player;
  puVar1 = (undefined8 *)
           ((ulong)(((&DAT_017e1e88)[lVar2 * 0xa8] - 1 & 0x208) * 0x18) +
           (&DAT_017e1e78)[lVar2 * 0x54]);
  do {
    puVar3 = puVar1;
    puVar1 = (undefined8 *)*puVar3;
  } while (*(int *)(puVar3 + 1) != 0x208);
  R_CreatePlayerTranslation
            (local_34,local_38,local_3c,local_30,skins + *(int *)(puVar3[2] + 0x28),
             translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[lVar2].Ptr,
             translationtables[2].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[lVar2].Ptr,
             translationtables[9].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[lVar2].Ptr);
  return;
}

Assistant:

void R_BuildPlayerTranslation (int player)
{
	float h, s, v;
	FPlayerColorSet *colorset;

	D_GetPlayerColor (player, &h, &s, &v, &colorset);

	R_CreatePlayerTranslation (h, s, v, colorset,
		&skins[players[player].userinfo.GetSkin()],
		translationtables[TRANSLATION_Players][player],
		translationtables[TRANSLATION_PlayersExtra][player],
		translationtables[TRANSLATION_RainPillar][player]
		);
}